

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_mem.cpp
# Opt level: O0

void lzham::lzham_destroy_malloc_context(lzham_malloc_context context)

{
  int *in_RDI;
  malloc_context *p;
  uint in_stack_000001e4;
  char *in_stack_000001e8;
  char *in_stack_000001f0;
  
  if (in_RDI != (int *)0x0) {
    if (*in_RDI != 0x5749abcd) {
      lzham_assert(in_stack_000001f0,in_stack_000001e8,in_stack_000001e4);
    }
    lzham_print_mem_stats((lzham_malloc_context)0x1255ca);
    helpers::destruct<lzham::malloc_context>((malloc_context *)0x1255d4);
    *in_RDI = -0x21522153;
    (*(code *)g_pRealloc)(in_RDI,0,0,1,g_pUser_data);
  }
  return;
}

Assistant:

void lzham_destroy_malloc_context(lzham_malloc_context context)
   {
      LZHAM_ASSERT(context);
      if (context)
      {
         malloc_context *p = static_cast<malloc_context *>(context);
         LZHAM_VERIFY(p->m_sig == malloc_context::cSig);

         lzham_print_mem_stats(p);
                           
         helpers::destruct(p);
         p->m_sig = 0xDEADDEAD;

         (*g_pRealloc)(p, 0, NULL, true, g_pUser_data);
      }
   }